

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::cord_internal::anon_unknown_0::
AnalyzeDataEdge<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
          (anon_unknown_0 *this,
          CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> rep,
          RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *raw_usage)

{
  int iVar1;
  bool bVar2;
  anon_unknown_0 aVar3;
  int iVar4;
  CordRepSubstring *pCVar5;
  CordRepFlat *this_00;
  size_t sVar6;
  Nonnull<const_CordRep_*> pCVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double local_18;
  
  local_18 = rep.fraction;
  pCVar7 = rep.rep;
  bVar2 = IsDataEdge((CordRep *)this);
  if (bVar2) {
    aVar3 = this[0xc];
    if (aVar3 == (anon_unknown_0)0x1) {
      pCVar7->length = (size_t)(local_18 * 32.0 + (double)pCVar7->length);
      pCVar5 = CordRep::substring((CordRep *)this);
      this = (anon_unknown_0 *)pCVar5->child;
      iVar1 = (((CordRep *)this)->refcount).count_.super___atomic_base<int>._M_i;
      iVar4 = iVar1 >> 1;
      auVar8._8_4_ = iVar1 >> 0x1f;
      auVar8._0_8_ = (long)iVar4;
      auVar8._12_4_ = 0x45300000;
      local_18 = local_18 /
                 ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0));
      aVar3 = (anon_unknown_0)((CordRep *)this)->tag;
    }
    if ((byte)aVar3 < 6) {
      sVar6 = ((CordRep *)this)->length + 0x28;
    }
    else {
      this_00 = CordRep::flat((CordRep *)this);
      sVar6 = CordRepFlat::AllocatedSize(this_00);
    }
    auVar9._8_4_ = (int)(sVar6 >> 0x20);
    auVar9._0_8_ = sVar6;
    auVar9._12_4_ = 0x45300000;
    pCVar7->length =
         (size_t)(((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) * local_18 +
                 (double)pCVar7->length);
    return;
  }
  __assert_fail("IsDataEdge(rep.rep)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord_analysis.cc"
                ,0x78,
                "void absl::cord_internal::(anonymous namespace)::AnalyzeDataEdge(CordRepRef<mode>, RawUsage<mode> &) [mode = absl::cord_internal::(anonymous namespace)::Mode::kFairShare]"
               );
}

Assistant:

void AnalyzeDataEdge(CordRepRef<mode> rep, RawUsage<mode>& raw_usage) {
  assert(IsDataEdge(rep.rep));

  // Consume all substrings
  if (rep.rep->tag == SUBSTRING) {
    raw_usage.Add(sizeof(CordRepSubstring), rep);
    rep = rep.Child(rep.rep->substring()->child);
  }

  // Consume FLAT / EXTERNAL
  const size_t size =
      rep.rep->tag >= FLAT
          ? rep.rep->flat()->AllocatedSize()
          : rep.rep->length + sizeof(CordRepExternalImpl<intptr_t>);
  raw_usage.Add(size, rep);
}